

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::is_close(matrix4d *a,matrix4d *b,double eps)

{
  bool bVar1;
  bool local_21;
  double eps_local;
  matrix4d *b_local;
  matrix4d *a_local;
  
  bVar1 = math::is_close(a->m[0][0],b->m[0][0],eps);
  local_21 = false;
  if (bVar1) {
    bVar1 = math::is_close(a->m[0][1],b->m[0][1],eps);
    local_21 = false;
    if (bVar1) {
      bVar1 = math::is_close(a->m[0][2],b->m[0][2],eps);
      local_21 = false;
      if (bVar1) {
        bVar1 = math::is_close(a->m[0][3],b->m[0][3],eps);
        local_21 = false;
        if (bVar1) {
          bVar1 = math::is_close(a->m[1][0],b->m[1][0],eps);
          local_21 = false;
          if (bVar1) {
            bVar1 = math::is_close(a->m[1][1],b->m[1][1],eps);
            local_21 = false;
            if (bVar1) {
              bVar1 = math::is_close(a->m[1][2],b->m[1][2],eps);
              local_21 = false;
              if (bVar1) {
                bVar1 = math::is_close(a->m[1][3],b->m[1][3],eps);
                local_21 = false;
                if (bVar1) {
                  bVar1 = math::is_close(a->m[2][0],b->m[2][0],eps);
                  local_21 = false;
                  if (bVar1) {
                    bVar1 = math::is_close(a->m[2][1],b->m[2][1],eps);
                    local_21 = false;
                    if (bVar1) {
                      bVar1 = math::is_close(a->m[2][2],b->m[2][2],eps);
                      local_21 = false;
                      if (bVar1) {
                        bVar1 = math::is_close(a->m[2][3],b->m[2][3],eps);
                        local_21 = false;
                        if (bVar1) {
                          bVar1 = math::is_close(a->m[3][0],b->m[3][0],eps);
                          local_21 = false;
                          if (bVar1) {
                            bVar1 = math::is_close(a->m[3][1],b->m[3][1],eps);
                            local_21 = false;
                            if (bVar1) {
                              bVar1 = math::is_close(a->m[3][2],b->m[3][2],eps);
                              local_21 = false;
                              if (bVar1) {
                                local_21 = math::is_close(a->m[3][3],b->m[3][3],eps);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_21;
}

Assistant:

bool is_close(const value::matrix4d &a, const value::matrix4d &b, const double eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[0][2], b.m[0][2], eps) &&
         math::is_close(a.m[0][3], b.m[0][3], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps) &&
         math::is_close(a.m[1][2], b.m[1][2], eps) &&
         math::is_close(a.m[1][3], b.m[1][3], eps) &&
         math::is_close(a.m[2][0], b.m[2][0], eps) &&
         math::is_close(a.m[2][1], b.m[2][1], eps) &&
         math::is_close(a.m[2][2], b.m[2][2], eps) &&
         math::is_close(a.m[2][3], b.m[2][3], eps) &&
         math::is_close(a.m[3][0], b.m[3][0], eps) &&
         math::is_close(a.m[3][1], b.m[3][1], eps) &&
         math::is_close(a.m[3][2], b.m[3][2], eps) &&
         math::is_close(a.m[3][3], b.m[3][3], eps);
}